

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deSocket * deSocket_accept(deSocket *sock,deSocketAddress *clientAddress)

{
  int handle;
  deBool dVar1;
  deMutex dVar2;
  socklen_t local_64;
  sockaddr *psStack_60;
  NativeSocklen bsdAddrLen;
  sockaddr *bsdAddr;
  deUint8 bsdAddrBuf [28];
  deSocket *newSock;
  deSocketHandle newFd;
  deSocketAddress *clientAddress_local;
  deSocket *sock_local;
  
  psStack_60 = (sockaddr *)&bsdAddr;
  local_64 = 0x1c;
  deMemset(psStack_60,0,0x1c);
  handle = accept(sock->handle,psStack_60,&local_64);
  dVar1 = deSocketHandleIsValid(handle);
  if (dVar1 == 0) {
    sock_local = (deSocket *)0x0;
  }
  else {
    sock_local = (deSocket *)deCalloc(0x18);
    if (sock_local == (deSocket *)0x0) {
      close(handle);
      sock_local = (deSocket *)0x0;
    }
    else {
      dVar2 = deMutex_create((deMutexAttributes *)0x0);
      sock_local->stateLock = dVar2;
      sock_local->handle = handle;
      sock_local->state = DE_SOCKETSTATE_CONNECTED;
      sock_local->openChannels = 3;
      if (clientAddress != (deSocketAddress *)0x0) {
        deBsdAddressToSocketAddress(clientAddress,(sockaddr *)psStack_60,local_64);
      }
    }
  }
  return sock_local;
}

Assistant:

deSocket* deSocket_accept (deSocket* sock, deSocketAddress* clientAddress)
{
	deSocketHandle		newFd		= DE_INVALID_SOCKET_HANDLE;
	deSocket*			newSock		= DE_NULL;
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen	= (NativeSocklen)sizeof(bsdAddrBuf);

	deMemset(bsdAddr, 0, (size_t)bsdAddrLen);

	newFd = accept(sock->handle, bsdAddr, &bsdAddrLen);
	if (!deSocketHandleIsValid(newFd))
		return DE_NULL;

	newSock = (deSocket*)deCalloc(sizeof(deSocket));
	if (!newSock)
	{
#if defined(DE_USE_WINSOCK)
		closesocket(newFd);
#else
		close(newFd);
#endif
		return DE_NULL;
	}

	newSock->stateLock		= deMutex_create(0);
	newSock->handle			= newFd;
	newSock->state			= DE_SOCKETSTATE_CONNECTED;
	newSock->openChannels	= DE_SOCKETCHANNEL_BOTH;

	if (clientAddress)
		deBsdAddressToSocketAddress(clientAddress, bsdAddr, (int)bsdAddrLen);

	return newSock;
}